

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputable.cpp
# Opt level: O0

void snestistics::initLookupTables(void)

{
  char *__s1;
  int iVar1;
  char *i;
  int ih;
  
  for (i._4_4_ = 0; i._4_4_ < 0x100; i._4_4_ = i._4_4_ + 1) {
    jumps[i._4_4_] = 0;
    branches[i._4_4_] = 0;
    branches8[i._4_4_] = 0;
    jump_or_branch[i._4_4_] = 0;
    pushpops[i._4_4_] = 0;
    __s1 = *(char **)(mnemonic_names + (long)i._4_4_ * 8);
    if (*__s1 == 'J') {
      jumps[i._4_4_] = 1;
      iVar1 = strcmp(__s1,"JMP");
      if (iVar1 == 0) {
        jump_or_branch[i._4_4_] = 1;
      }
    }
    else if (*__s1 == 'B') {
      jump_or_branch[i._4_4_] = 1;
      iVar1 = strcmp(__s1,"BRK");
      if ((iVar1 != 0) && (iVar1 = strcmp(__s1,"BIT"), iVar1 != 0)) {
        jumps[i._4_4_] = 1;
        branches[i._4_4_] = 1;
        iVar1 = strcmp(__s1,"BRL");
        if (iVar1 != 0) {
          branches8[i._4_4_] = 1;
        }
      }
    }
    else if ((*__s1 == 'P') && (__s1[1] == 'H')) {
      pushpops[i._4_4_] = 1;
    }
    else if ((*__s1 == 'P') && (__s1[1] == 'L')) {
      pushpops[i._4_4_] = 1;
    }
  }
  return;
}

Assistant:

void initLookupTables() {
	for (int ih = 0; ih<256; ih++) {
		jumps[ih] = false;
		branches[ih] = false;
		branches8[ih] = false;
		jump_or_branch[ih]=false;
		pushpops[ih] = false;
		const char * const i = snestistics::mnemonic_names[ih];
		if (i[0] == 'J') {
			jumps[ih] = true;
			if (strcmp(i, "JMP")==0)
				jump_or_branch[ih] = true;
		}
		else if (i[0] == 'B') {
			jump_or_branch[ih] = true;
			if (strcmp(i, "BRK") == 0) continue;
			if (strcmp(i, "BIT") == 0) continue;
			jumps[ih] = true;
			branches[ih] = true;
			if (strcmp(i, "BRL") == 0) continue;
			branches8[ih] = true;
		} else if (i[0]=='P' && i[1]=='H') {
			pushpops[ih] = true;
		} else if (i[0]=='P' && i[1]=='L') {
			pushpops[ih] = true;
		}
	}
}